

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

void __thiscall phosg::io_error::io_error(io_error *this,int fd,string *what)

{
  string sStack_38;
  
  string_printf_abi_cxx11_(&sStack_38,"io error on fd %d: %s",fd,(what->_M_dataplus)._M_p);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  this->_vptr_io_error = (_func_int **)0x125ba0;
  *(undefined8 *)&this->field_0x10 = 0x125bd0;
  this->error = -1;
  return;
}

Assistant:

io_error::io_error(int fd, const string& what)
    : runtime_error(string_printf("io error on fd %d: %s", fd, what.c_str())),
      error(-1) {}